

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> __thiscall
wallet::DescriptorScriptPubKeyMan::GetSigningProvider
          (DescriptorScriptPubKeyMan *this,int32_t index,bool include_private)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  element_type *peVar4;
  type pFVar5;
  byte in_CL;
  uint in_EDX;
  long *in_RSI;
  __uniq_ptr_data<FlatSigningProvider,_std::default_delete<FlatSigningProvider>,_true,_true> in_RDI;
  long in_FS_OFFSET;
  vector<CScript,_std::allocator<CScript>_> scripts_temp;
  iterator it;
  unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> out_keys;
  FlatSigningProvider master_provider;
  undefined4 in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  FlatSigningProvider *in_stack_fffffffffffffcf0;
  FlatSigningProvider *in_stack_fffffffffffffcf8;
  key_type_conflict2 *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  FlatSigningProvider *in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  DescriptorScriptPubKeyMan *in_stack_fffffffffffffd50;
  undefined1 local_260 [24];
  _Base_ptr local_248;
  _Base_ptr local_240;
  uint local_22c;
  map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_> local_228;
  undefined1 local_1f8 [496];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_22c = in_EDX;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0,
             in_stack_fffffffffffffcec,(AnnotatedMixin<std::recursive_mutex> *)0xa2788a);
  std::make_unique<FlatSigningProvider>();
  local_240 = (_Base_ptr)
              std::
              map<int,_FlatSigningProvider,_std::less<int>,_std::allocator<std::pair<const_int,_FlatSigningProvider>_>_>
              ::find((map<int,_FlatSigningProvider,_std::less<int>,_std::allocator<std::pair<const_int,_FlatSigningProvider>_>_>
                      *)in_stack_fffffffffffffcf0,
                     (key_type_conflict2 *)
                     CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  local_248 = (_Base_ptr)
              std::
              map<int,_FlatSigningProvider,_std::less<int>,_std::allocator<std::pair<const_int,_FlatSigningProvider>_>_>
              ::end((map<int,_FlatSigningProvider,_std::less<int>,_std::allocator<std::pair<const_int,_FlatSigningProvider>_>_>
                     *)in_stack_fffffffffffffcf0);
  bVar1 = std::operator==((_Self *)in_stack_fffffffffffffcf8,(_Self *)in_stack_fffffffffffffcf0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::vector<CScript,_std::allocator<CScript>_>::vector
              ((vector<CScript,_std::allocator<CScript>_> *)
               CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    peVar4 = std::__shared_ptr_access<Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    uVar3 = local_22c;
    pFVar5 = std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::
             operator*((unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> *
                       )in_stack_fffffffffffffcf8);
    uVar3 = (*peVar4->_vptr_Descriptor[9])(peVar4,(ulong)uVar3,in_RSI + 0x35,local_260,pFVar5);
    bVar1 = (uVar3 & 1) != 0;
    if (bVar1) {
      std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::operator*
                ((unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> *)
                 in_stack_fffffffffffffcf8);
      std::
      map<int,_FlatSigningProvider,_std::less<int>,_std::allocator<std::pair<const_int,_FlatSigningProvider>_>_>
      ::operator[]((map<int,_FlatSigningProvider,_std::less<int>,_std::allocator<std::pair<const_int,_FlatSigningProvider>_>_>
                    *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                   in_stack_fffffffffffffd08);
      FlatSigningProvider::operator=(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    }
    else {
      std::unique_ptr<FlatSigningProvider,std::default_delete<FlatSigningProvider>>::
      unique_ptr<std::default_delete<FlatSigningProvider>,void>
                ((unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> *)
                 CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),(nullptr_t)0xa27a48);
    }
    std::vector<CScript,_std::allocator<CScript>_>::~vector
              ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffffcf8);
    if (!bVar1) goto LAB_00a27c18;
  }
  else {
    in_stack_fffffffffffffd50 =
         (DescriptorScriptPubKeyMan *)
         std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::operator->
                   ((unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> *)
                    CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    std::_Rb_tree_iterator<std::pair<const_int,_FlatSigningProvider>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_int,_FlatSigningProvider>_> *)
               CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    FlatSigningProvider::FlatSigningProvider
              ((FlatSigningProvider *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
               in_stack_fffffffffffffd20);
    FlatSigningProvider::Merge(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    FlatSigningProvider::~FlatSigningProvider
              ((FlatSigningProvider *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8))
    ;
  }
  bVar2 = (**(code **)(*in_RSI + 0x78))();
  if (((bVar2 & 1) != 0) && ((in_CL & 1) != 0)) {
    FlatSigningProvider::FlatSigningProvider
              ((FlatSigningProvider *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8))
    ;
    GetKeys(in_stack_fffffffffffffd50);
    std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::
    operator=((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
               *)in_stack_fffffffffffffcf8,&local_228);
    std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::~map
              ((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    in_stack_fffffffffffffcf8 =
         (FlatSigningProvider *)
         std::__shared_ptr_access<Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                   ((__shared_ptr_access<Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    pFVar5 = std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::
             operator*((unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> *
                       )in_stack_fffffffffffffcf8);
    (*(code *)(((((__uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> *
                  )&(in_stack_fffffffffffffcf8->super_SigningProvider)._vptr_SigningProvider)->_M_t)
                .
                super__Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>
                .super__Head_base<0UL,_FlatSigningProvider_*,_false>._M_head_impl)->pubkeys)._M_t.
              _M_impl.super__Rb_tree_header._M_header._M_left)
              (in_stack_fffffffffffffcf8,(ulong)local_22c,local_1f8,pFVar5);
    FlatSigningProvider::~FlatSigningProvider
              ((FlatSigningProvider *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8))
    ;
  }
  std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::unique_ptr
            ((unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> *)
             CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
             (unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> *)0xa27c0d)
  ;
LAB_00a27c18:
  std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::~unique_ptr
            ((unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> *)
             in_stack_fffffffffffffcf8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<FlatSigningProvider,_std::default_delete<FlatSigningProvider>,_true,_true>
         )(tuple<FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>)
          in_RDI.
          super___uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>._M_t
          .super__Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>.
          super__Head_base<0UL,_FlatSigningProvider_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<FlatSigningProvider> DescriptorScriptPubKeyMan::GetSigningProvider(int32_t index, bool include_private) const
{
    AssertLockHeld(cs_desc_man);

    std::unique_ptr<FlatSigningProvider> out_keys = std::make_unique<FlatSigningProvider>();

    // Fetch SigningProvider from cache to avoid re-deriving
    auto it = m_map_signing_providers.find(index);
    if (it != m_map_signing_providers.end()) {
        out_keys->Merge(FlatSigningProvider{it->second});
    } else {
        // Get the scripts, keys, and key origins for this script
        std::vector<CScript> scripts_temp;
        if (!m_wallet_descriptor.descriptor->ExpandFromCache(index, m_wallet_descriptor.cache, scripts_temp, *out_keys)) return nullptr;

        // Cache SigningProvider so we don't need to re-derive if we need this SigningProvider again
        m_map_signing_providers[index] = *out_keys;
    }

    if (HavePrivateKeys() && include_private) {
        FlatSigningProvider master_provider;
        master_provider.keys = GetKeys();
        m_wallet_descriptor.descriptor->ExpandPrivate(index, master_provider, *out_keys);
    }

    return out_keys;
}